

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O2

int GetCopyDistance(int distance_symbol,VP8LBitReader *br)

{
  uint32_t uVar1;
  uint n_bits;
  
  if (3 < distance_symbol) {
    n_bits = distance_symbol - 2U >> 1;
    uVar1 = VP8LReadBits(br,n_bits);
    distance_symbol = uVar1 + ((distance_symbol & 1U | 2) << ((byte)n_bits & 0x1f));
  }
  return distance_symbol + 1;
}

Assistant:

static WEBP_INLINE int GetCopyDistance(int distance_symbol,
                                       VP8LBitReader* const br) {
  int extra_bits, offset;
  if (distance_symbol < 4) {
    return distance_symbol + 1;
  }
  extra_bits = (distance_symbol - 2) >> 1;
  offset = (2 + (distance_symbol & 1)) << extra_bits;
  return offset + VP8LReadBits(br, extra_bits) + 1;
}